

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlRegStatePtr xmlRegStatePush(xmlRegParserCtxtPtr ctxt)

{
  uint uVar1;
  int iVar2;
  xmlRegStatePtr *ppxVar3;
  xmlRegStatePtr pxVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = ctxt->maxStates;
  if ((int)uVar1 <= ctxt->nbStates) {
    if ((int)uVar1 < 1) {
      uVar6 = 4;
    }
    else {
      if (999999999 < uVar1) goto LAB_0017c383;
      uVar5 = uVar1 + 1 >> 1;
      uVar6 = uVar5 + uVar1;
      if (1000000000 - uVar5 < uVar1) {
        uVar6 = 1000000000;
      }
    }
    ppxVar3 = (xmlRegStatePtr *)(*xmlRealloc)(ctxt->states,(ulong)uVar6 << 3);
    if (ppxVar3 == (xmlRegStatePtr *)0x0) goto LAB_0017c383;
    ctxt->states = ppxVar3;
    ctxt->maxStates = uVar6;
  }
  pxVar4 = (xmlRegStatePtr)(*xmlMalloc)(0x38);
  if (pxVar4 != (xmlRegStatePtr)0x0) {
    pxVar4->maxTransTo = 0;
    pxVar4->nbTransTo = 0;
    pxVar4->transTo = (int *)0x0;
    *(undefined8 *)&pxVar4->nbTrans = 0;
    pxVar4->trans = (xmlRegTrans *)0x0;
    pxVar4->markd = XML_REGEXP_MARK_NORMAL;
    pxVar4->reached = XML_REGEXP_MARK_NORMAL;
    pxVar4->no = 0;
    pxVar4->maxTrans = 0;
    pxVar4->type = XML_REGEXP_TRANS_STATE;
    pxVar4->mark = XML_REGEXP_MARK_NORMAL;
    iVar2 = ctxt->nbStates;
    pxVar4->no = iVar2;
    ctxt->nbStates = iVar2 + 1;
    ctxt->states[iVar2] = pxVar4;
    return pxVar4;
  }
LAB_0017c383:
  ctxt->error = 2;
  xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                      (xmlError *)0x0);
  return (xmlRegStatePtr)0x0;
}

Assistant:

static xmlRegStatePtr
xmlRegStatePush(xmlRegParserCtxtPtr ctxt) {
    xmlRegStatePtr state;

    if (ctxt->nbStates >= ctxt->maxStates) {
	xmlRegStatePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxStates, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	tmp = xmlRealloc(ctxt->states, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	ctxt->states = tmp;
	ctxt->maxStates = newSize;
    }

    state = xmlRegNewState(ctxt);
    if (state == NULL)
        return(NULL);

    state->no = ctxt->nbStates;
    ctxt->states[ctxt->nbStates++] = state;

    return(state);
}